

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMutexUnix.c
# Opt level: O0

deMutex deMutex_create(deMutexAttributes *attributes)

{
  int iVar1;
  pthread_mutex_t *__mutex;
  pthread_mutex_t *mutex;
  int ret;
  pthread_mutexattr_t attr;
  deMutexAttributes *attributes_local;
  
  _ret = attributes;
  __mutex = (pthread_mutex_t *)deMalloc(0x28);
  if (__mutex == (pthread_mutex_t *)0x0) {
    attributes_local = (deMutexAttributes *)0x0;
  }
  else {
    iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)((long)&mutex + 4));
    if (iVar1 == 0) {
      iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)((long)&mutex + 4),0);
      if (iVar1 == 0) {
        if (((_ret == (deMutexAttributes *)0x0) || ((_ret->flags & 1) == 0)) ||
           (iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)((long)&mutex + 4),1),
           iVar1 == 0)) {
          mutex._0_4_ = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)((long)&mutex + 4));
          if ((int)mutex == 0) {
            pthread_mutexattr_destroy((pthread_mutexattr_t *)((long)&mutex + 4));
            attributes_local = (deMutexAttributes *)__mutex;
          }
          else {
            pthread_mutexattr_destroy((pthread_mutexattr_t *)((long)&mutex + 4));
            deFree(__mutex);
            attributes_local = (deMutexAttributes *)0x0;
          }
        }
        else {
          pthread_mutexattr_destroy((pthread_mutexattr_t *)((long)&mutex + 4));
          deFree(__mutex);
          attributes_local = (deMutexAttributes *)0x0;
        }
      }
      else {
        pthread_mutexattr_destroy((pthread_mutexattr_t *)((long)&mutex + 4));
        deFree(__mutex);
        attributes_local = (deMutexAttributes *)0x0;
      }
    }
    else {
      deFree(__mutex);
      attributes_local = (deMutexAttributes *)0x0;
    }
  }
  return (deMutex)attributes_local;
}

Assistant:

deMutex deMutex_create (const deMutexAttributes* attributes)
{
	pthread_mutexattr_t	attr;
	int					ret;
	pthread_mutex_t*	mutex = deMalloc(sizeof(pthread_mutex_t));

	if (!mutex)
		return 0;

	if (pthread_mutexattr_init(&attr) != 0)
	{
		deFree(mutex);
		return 0;
	}

#if defined(DE_DEBUG)
	if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_ERRORCHECK) != 0)
#else
	if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_NORMAL) != 0)
#endif
	{
		pthread_mutexattr_destroy(&attr);
		deFree(mutex);
		return 0;
	}

	if (attributes)
	{
		if (attributes->flags & DE_MUTEX_RECURSIVE)
		{
			if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE) != 0)
			{
				pthread_mutexattr_destroy(&attr);
				deFree(mutex);
				return 0;
			}
		}
	}

	ret = pthread_mutex_init(mutex, &attr);
	if (ret != 0)
	{
		pthread_mutexattr_destroy(&attr);
		deFree(mutex);
		return 0;
	}

	pthread_mutexattr_destroy(&attr);

	return (deMutex)mutex;
}